

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseImport
          (Parser *this,
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *dependency,RepeatedField<int> *public_dependency,RepeatedField<int> *weak_dependency,
          LocationRecorder *root_location,FileDescriptorProto *containing_file)

{
  int iVar1;
  Rep *pRVar2;
  ArenaImpl *this_00;
  bool bVar3;
  int iVar4;
  string *psVar5;
  string *psVar6;
  string import_file;
  LocationRecorder weak_location;
  LocationRecorder location;
  string local_80;
  undefined1 local_60 [40];
  long local_38;
  
  LocationRecorder::LocationRecorder
            ((LocationRecorder *)(local_60 + 0x18),root_location,3,
             (dependency->super_RepeatedPtrFieldBase).current_size_);
  bVar3 = Consume(this,"import");
  if (bVar3) {
    iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar4 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
      if (iVar4 == 0) {
        LocationRecorder::LocationRecorder
                  ((LocationRecorder *)local_60,root_location,0xb,weak_dependency->current_size_);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"weak","");
        if (*(SourceLocationTable **)(local_60._0_8_ + 0x18) != (SourceLocationTable *)0x0) {
          SourceLocationTable::AddImport
                    (*(SourceLocationTable **)(local_60._0_8_ + 0x18),
                     &containing_file->super_Message,&local_80,**(int **)(local_60._16_8_ + 0x38),
                     (*(int **)(local_60._16_8_ + 0x38))[1]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        bVar3 = Consume(this,"weak");
        if (!bVar3) {
          psVar6 = (string *)local_60;
          goto LAB_0030e735;
        }
        iVar4 = (dependency->super_RepeatedPtrFieldBase).current_size_;
        if (weak_dependency->current_size_ == weak_dependency->total_size_) {
          RepeatedField<int>::Reserve(weak_dependency,weak_dependency->total_size_ + 1);
        }
        iVar1 = weak_dependency->current_size_;
        weak_dependency->current_size_ = iVar1 + 1;
        *(int *)((long)weak_dependency->arena_or_elements_ + (long)iVar1 * 4) = iVar4;
        psVar6 = (string *)local_60;
LAB_0030e6c6:
        LocationRecorder::~LocationRecorder((LocationRecorder *)psVar6);
        if (bVar3 == false) goto LAB_0030e73a;
      }
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      bVar3 = ConsumeString(this,&local_80,"Expected a string naming the file to import.");
      if (bVar3) {
        pRVar2 = (dependency->super_RepeatedPtrFieldBase).rep_;
        if (pRVar2 == (Rep *)0x0) {
LAB_0030e75d:
          internal::RepeatedPtrFieldBase::Reserve
                    (&dependency->super_RepeatedPtrFieldBase,
                     (dependency->super_RepeatedPtrFieldBase).total_size_ + 1);
LAB_0030e76b:
          pRVar2 = (dependency->super_RepeatedPtrFieldBase).rep_;
          pRVar2->allocated_size = pRVar2->allocated_size + 1;
          this_00 = (ArenaImpl *)(dependency->super_RepeatedPtrFieldBase).arena_;
          if (this_00 == (ArenaImpl *)0x0) {
            psVar5 = (string *)operator_new(0x20);
          }
          else {
            if (this_00[1].initial_block_ != (Block *)0x0) {
              Arena::OnArenaAllocation
                        ((Arena *)this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
            }
            psVar5 = (string *)
                     internal::ArenaImpl::AllocateAlignedAndAddCleanup
                               (this_00,0x20,internal::arena_destruct_object<std::__cxx11::string>);
          }
          *(string **)psVar5 = psVar5 + 0x10;
          *(long *)(psVar5 + 8) = 0;
          psVar5[0x10] = (string)0x0;
          iVar4 = (dependency->super_RepeatedPtrFieldBase).current_size_;
          (dependency->super_RepeatedPtrFieldBase).current_size_ = iVar4 + 1;
          ((dependency->super_RepeatedPtrFieldBase).rep_)->elements[iVar4] = psVar5;
        }
        else {
          iVar4 = (dependency->super_RepeatedPtrFieldBase).current_size_;
          if (pRVar2->allocated_size <= iVar4) {
            if (pRVar2->allocated_size == (dependency->super_RepeatedPtrFieldBase).total_size_)
            goto LAB_0030e75d;
            goto LAB_0030e76b;
          }
          (dependency->super_RepeatedPtrFieldBase).current_size_ = iVar4 + 1;
          psVar5 = (string *)pRVar2->elements[iVar4];
        }
        std::__cxx11::string::_M_assign(psVar5);
        if (*(SourceLocationTable **)(local_60._24_8_ + 0x18) != (SourceLocationTable *)0x0) {
          SourceLocationTable::AddImport
                    (*(SourceLocationTable **)(local_60._24_8_ + 0x18),
                     &containing_file->super_Message,&local_80,**(int **)(local_38 + 0x38),
                     (*(int **)(local_38 + 0x38))[1]);
        }
        bVar3 = ConsumeEndOfDeclaration(this,";",(LocationRecorder *)(local_60 + 0x18));
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      goto LAB_0030e73c;
    }
    LocationRecorder::LocationRecorder
              ((LocationRecorder *)&local_80,root_location,10,public_dependency->current_size_);
    bVar3 = Consume(this,"public");
    if (bVar3) {
      iVar4 = (dependency->super_RepeatedPtrFieldBase).current_size_;
      if (public_dependency->current_size_ == public_dependency->total_size_) {
        RepeatedField<int>::Reserve(public_dependency,public_dependency->total_size_ + 1);
      }
      iVar1 = public_dependency->current_size_;
      public_dependency->current_size_ = iVar1 + 1;
      *(int *)((long)public_dependency->arena_or_elements_ + (long)iVar1 * 4) = iVar4;
      psVar6 = &local_80;
      goto LAB_0030e6c6;
    }
    psVar6 = &local_80;
LAB_0030e735:
    LocationRecorder::~LocationRecorder((LocationRecorder *)psVar6);
  }
LAB_0030e73a:
  bVar3 = false;
LAB_0030e73c:
  LocationRecorder::~LocationRecorder((LocationRecorder *)(local_60 + 0x18));
  return bVar3;
}

Assistant:

bool Parser::ParseImport(RepeatedPtrField<std::string>* dependency,
                         RepeatedField<int32>* public_dependency,
                         RepeatedField<int32>* weak_dependency,
                         const LocationRecorder& root_location,
                         const FileDescriptorProto* containing_file) {
  LocationRecorder location(root_location,
                            FileDescriptorProto::kDependencyFieldNumber,
                            dependency->size());

  DO(Consume("import"));

  if (LookingAt("public")) {
    LocationRecorder public_location(
        root_location, FileDescriptorProto::kPublicDependencyFieldNumber,
        public_dependency->size());
    DO(Consume("public"));
    *public_dependency->Add() = dependency->size();
  } else if (LookingAt("weak")) {
    LocationRecorder weak_location(
        root_location, FileDescriptorProto::kWeakDependencyFieldNumber,
        weak_dependency->size());
    weak_location.RecordLegacyImportLocation(containing_file, "weak");
    DO(Consume("weak"));
    *weak_dependency->Add() = dependency->size();
  }

  string import_file;
  DO(ConsumeString(&import_file,
                   "Expected a string naming the file to import."));
  *dependency->Add() = import_file;
  location.RecordLegacyImportLocation(containing_file, import_file);

  DO(ConsumeEndOfDeclaration(";", &location));

  return true;
}